

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

void __thiscall Matrix<Complex>::inverseExt(Matrix<Complex> *this,Matrix<Complex> *ext)

{
  ulong uVar1;
  Complex *pCVar2;
  void *pvVar3;
  pointer puVar4;
  uint uVar5;
  matrix_error *this_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  Complex coeff;
  uint local_164;
  Complex local_148;
  Complex local_c0;
  
  if (this->N == this->M) {
    if (this->M == ext->M) {
      uVar5 = gauss(this,ext);
      local_164 = this->N;
      uVar8 = (ulong)local_164;
      if (uVar5 == local_164) {
        if (uVar8 != 0) {
          do {
            local_164 = local_164 - 1;
            uVar1 = uVar8 - 1;
            Complex::Complex(&local_148,1);
            iVar9 = (int)uVar1;
            ::operator/(&local_c0,&local_148,
                        this->arr + (ulong)(this->N * iVar9) + (uVar1 & 0xffffffff));
            if (local_148._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._im._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._im._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._re._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._re._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar6 = (ulong)this->N;
            if (this->N != 0) {
              lVar10 = 0;
              uVar7 = 0;
              do {
                Complex::operator*=((Complex *)
                                    ((long)&this->arr[(int)uVar6 * local_164]._re._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                    &local_c0);
                uVar7 = uVar7 + 1;
                uVar6 = (ulong)this->N;
                lVar10 = lVar10 + 0x80;
              } while (uVar7 < uVar6);
            }
            uVar6 = (ulong)ext->N;
            if (ext->N != 0) {
              lVar10 = 0;
              uVar7 = 0;
              do {
                Complex::operator*=((Complex *)
                                    ((long)&ext->arr[(int)uVar6 * local_164]._re._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                    &local_c0);
                uVar7 = uVar7 + 1;
                uVar6 = (ulong)ext->N;
                lVar10 = lVar10 + 0x80;
              } while (uVar7 < uVar6);
            }
            uVar5 = this->N;
            for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
              uVar5 = uVar5 * iVar9;
              pCVar2 = this->arr;
              if ((pCVar2[uVar5 + uVar8]._re._numerator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   pCVar2[uVar5 + uVar8]._re._numerator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish) ||
                 (pCVar2[uVar5 + uVar8]._im._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  pCVar2[uVar5 + uVar8]._im._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish)) {
                uVar6 = (ulong)ext->N;
                if (ext->N != 0) {
                  lVar10 = 0;
                  uVar7 = 0;
                  do {
                    ::operator*(&local_148,
                                (Complex *)
                                ((long)&ext->arr[(uint)((int)uVar6 * (int)uVar8)]._re._numerator.
                                        digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                this->arr + this->N * iVar9 + uVar8);
                    Complex::operator-=((Complex *)
                                        ((long)&ext->arr[ext->N * local_164]._re._numerator.digits.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                        &local_148);
                    if (local_148._im._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_148._im._denominator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_148._im._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_148._im._numerator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_148._re._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_148._re._denominator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_148._re._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_148._re._numerator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar7 = uVar7 + 1;
                    uVar6 = (ulong)ext->N;
                    lVar10 = lVar10 + 0x80;
                  } while (uVar7 < uVar6);
                }
                Complex::Complex(&local_148);
                uVar5 = this->N * iVar9;
                pCVar2 = this->arr;
                pvVar3 = pCVar2[uVar5 + uVar8]._re._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_148._re._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148._re._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pCVar2[uVar5 + uVar8]._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_148._re._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_148._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (pvVar3 != (void *)0x0) {
                  operator_delete(pvVar3);
                }
                pCVar2[uVar5 + uVar8]._re._numerator.negative = local_148._re._numerator.negative;
                puVar4 = pCVar2[uVar5 + uVar8]._re._denominator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_148._re._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148._re._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pCVar2[uVar5 + uVar8]._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_148._re._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_148._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (puVar4 != (pointer)0x0) {
                  operator_delete(puVar4);
                }
                pCVar2[uVar5 + uVar8]._re._denominator.negative =
                     local_148._re._denominator.negative;
                puVar4 = pCVar2[uVar5 + uVar8]._im._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_148._im._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148._im._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pCVar2[uVar5 + uVar8]._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_148._im._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_148._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (puVar4 != (pointer)0x0) {
                  operator_delete(puVar4);
                }
                pCVar2[uVar5 + uVar8]._im._numerator.negative = local_148._im._numerator.negative;
                puVar4 = pCVar2[uVar5 + uVar8]._im._denominator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_148._im._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pCVar2[uVar5 + uVar8]._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148._im._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pCVar2[uVar5 + uVar8]._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_148._im._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_148._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (puVar4 != (pointer)0x0) {
                  operator_delete(puVar4);
                }
                pCVar2[uVar5 + uVar8]._im._denominator.negative =
                     local_148._im._denominator.negative;
                if (local_148._im._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_148._im._denominator.digits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_148._im._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_148._im._numerator.digits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_148._re._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_148._re._denominator.digits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_148._re._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_148._re._numerator.digits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              uVar5 = this->N;
            }
            if (local_c0._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0._im._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c0._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0._im._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c0._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0._re._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c0._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0._re._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar8 = uVar1;
          } while (iVar9 != 0);
        }
        return;
      }
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Cannot inverse a singular matrix");
    }
    else {
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Invalid use of inverseExt");
    }
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to inverse a non-square matrix");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}